

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O0

void nn_bipc_start_listening(nn_bipc *self)

{
  FILE *pFVar1;
  int __fd;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  uint *puVar5;
  bool bVar6;
  int fd;
  char *addr;
  sockaddr_un *un;
  sockaddr_storage ss;
  int rc;
  nn_bipc *self_local;
  
  pcVar2 = nn_epbase_getaddr(&self->epbase);
  memset(&un,0,0x80);
  sVar3 = strlen(pcVar2);
  if (0x6b < sVar3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (addr) < sizeof (un->sun_path)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
            ,0x18a);
    fflush(_stderr);
    nn_err_abort();
  }
  un._0_2_ = 1;
  strncpy((char *)((long)&un + 2),pcVar2,0x6c);
  __fd = socket(1,1,0);
  if (-1 < __fd) {
    ss.__ss_align._4_4_ = fcntl(__fd,4,0x800);
    bVar6 = true;
    if (ss.__ss_align._4_4_ == -1) {
      piVar4 = __errno_location();
      bVar6 = *piVar4 == 0x16;
    }
    pFVar1 = _stderr;
    if (!bVar6) {
      piVar4 = __errno_location();
      pcVar2 = nn_err_strerror(*piVar4);
      puVar5 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
              ,0x196);
      fflush(_stderr);
      nn_err_abort();
    }
    ss.__ss_align._4_4_ = connect(__fd,(sockaddr *)&un,0x6e);
    if ((ss.__ss_align._4_4_ == -1) && (piVar4 = __errno_location(), *piVar4 == 0x6f)) {
      ss.__ss_align._4_4_ = unlink(pcVar2);
      bVar6 = true;
      if (ss.__ss_align._4_4_ != 0) {
        piVar4 = __errno_location();
        bVar6 = *piVar4 == 2;
      }
      pFVar1 = _stderr;
      if (!bVar6) {
        piVar4 = __errno_location();
        pcVar2 = nn_err_strerror(*piVar4);
        puVar5 = (uint *)__errno_location();
        fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
                ,0x19b);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    ss.__ss_align._4_4_ = close(__fd);
    pFVar1 = _stderr;
    if (ss.__ss_align._4_4_ != 0) {
      piVar4 = __errno_location();
      pcVar2 = nn_err_strerror(*piVar4);
      puVar5 = (uint *)__errno_location();
      fprintf(pFVar1,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/bipc.c"
              ,0x19e);
      fflush(_stderr);
      nn_err_abort();
    }
    ss.__ss_align._4_4_ = 0;
  }
  ss.__ss_align._4_4_ = nn_usock_start(&self->usock,1,1,0);
  if (ss.__ss_align._4_4_ < 0) {
    nn_backoff_start(&self->retry);
    self->state = 7;
  }
  else {
    ss.__ss_align._4_4_ = nn_usock_bind(&self->usock,(sockaddr *)&un,0x6e);
    if (ss.__ss_align._4_4_ < 0) {
      nn_usock_stop(&self->usock);
      self->state = 8;
    }
    else {
      ss.__ss_align._4_4_ = nn_usock_listen(&self->usock,10);
      if (ss.__ss_align._4_4_ < 0) {
        nn_usock_stop(&self->usock);
        self->state = 8;
      }
      else {
        nn_bipc_start_accepting(self);
        self->state = 2;
      }
    }
  }
  return;
}

Assistant:

static void nn_bipc_start_listening (struct nn_bipc *self)
{
    int rc;
    struct sockaddr_storage ss;
    struct sockaddr_un *un;
    const char *addr;
#if !defined NN_HAVE_WINDOWS
    int fd;
#endif

    /*  First, create the AF_UNIX address. */
    addr = nn_epbase_getaddr (&self->epbase);
    memset (&ss, 0, sizeof (ss));
    un = (struct sockaddr_un*) &ss;
    nn_assert (strlen (addr) < sizeof (un->sun_path));
    ss.ss_family = AF_UNIX;
    strncpy (un->sun_path, addr, sizeof (un->sun_path));

    /*  Delete the IPC file left over by eventual previous runs of
        the application. We'll check whether the file is still in use by
        connecting to the endpoint. On Windows plaform, NamedPipe is used
        which does not have an underlying file. */
#if !defined NN_HAVE_WINDOWS
    fd = socket (AF_UNIX, SOCK_STREAM, 0);
    if (fd >= 0) {
        rc = fcntl (fd, F_SETFL, O_NONBLOCK);
        errno_assert (rc != -1 || errno == EINVAL);
        rc = connect (fd, (struct sockaddr*) &ss,
            sizeof (struct sockaddr_un));
        if (rc == -1 && errno == ECONNREFUSED) {
            rc = unlink (addr);
            errno_assert (rc == 0 || errno == ENOENT);
        }
        rc = close (fd);
        errno_assert (rc == 0);
    }
#endif

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, AF_UNIX, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_BIPC_STATE_WAITING;
        return;
    }

    rc = nn_usock_bind (&self->usock,
        (struct sockaddr*) &ss, sizeof (struct sockaddr_un));
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BIPC_STATE_CLOSING;
        return;
    }

    rc = nn_usock_listen (&self->usock, NN_BIPC_BACKLOG);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BIPC_STATE_CLOSING;
        return;
    }
    nn_bipc_start_accepting (self);
    self->state = NN_BIPC_STATE_ACTIVE;
}